

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

OrphanBuilder *
capnp::_::OrphanBuilder::initList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,ElementSize elementSize)

{
  undefined1 auVar1 [16];
  word *pwVar2;
  int iVar3;
  word *pwVar4;
  ulong uVar5;
  AllocateResult AVar6;
  anon_class_1_0_00000001 local_31;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  if (0x1fffffff < elementCount) {
    ::anon_func::anon_class_1_0_00000001::operator()(&local_31);
  }
  uVar5 = (ulong)elementCount *
          (ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (ulong)(uint)elementSize * 4)
          + 0x3f >> 6;
  if (arena == (BuilderArena *)0x0) {
    if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
        (int)(__return_storage_ptr__->tag).content != 0) {
      WireHelpers::zeroObject((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
    }
    iVar3 = ((uint)(_DAT_00000028 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _DAT_00000028;
    AVar6 = (AllocateResult)(auVar1 << 0x40);
    _DAT_00000028 = _DAT_00000028 + (uVar5 & 0xffffffff) * 8;
  }
  else {
    AVar6 = BuilderArena::allocate(arena,(SegmentWordCount)uVar5);
    iVar3 = -3;
  }
  pwVar4 = AVar6.words;
  *(int *)&(__return_storage_ptr__->tag).content = iVar3;
  *(ElementCount *)((long)&(__return_storage_ptr__->tag).content + 4) =
       elementCount << 3 | (uint)elementSize;
  __return_storage_ptr__->segment = AVar6.segment;
  __return_storage_ptr__->capTable = capTable;
  pwVar2 = pwVar4 + -1;
  if (pwVar4 == (word *)0x0) {
    pwVar2 = pwVar4;
  }
  if (elementSize != INLINE_COMPOSITE) {
    pwVar2 = pwVar4;
  }
  __return_storage_ptr__->location = pwVar2;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, ElementSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}